

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subject_set_register_tests.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::price::pixie::
SubjectSetRegisterTest_next_subscription_sync_has_new_edition_number_after_each_change_involving_a_unregistered_subject_Test
::
~SubjectSetRegisterTest_next_subscription_sync_has_new_edition_number_after_each_change_involving_a_unregistered_subject_Test
          (SubjectSetRegisterTest_next_subscription_sync_has_new_edition_number_after_each_change_involving_a_unregistered_subject_Test
           *this)

{
  SubjectSetRegisterTest_next_subscription_sync_has_new_edition_number_after_each_change_involving_a_unregistered_subject_Test
  *this_local;
  
  ~SubjectSetRegisterTest_next_subscription_sync_has_new_edition_number_after_each_change_involving_a_unregistered_subject_Test
            (this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(SubjectSetRegisterTest, next_subscription_sync_has_new_edition_number_after_each_change_involving_a_unregistered_subject)
{
    SubjectSetRegister subject_register = SubjectSetRegister();

    subject_register.Register(SS_SUBJECT0, false);
    std::optional<SubscriptionSync> message = subject_register.NextSubscriptionSync();
    ASSERT_TRUE(message);
    ASSERT_EQ(1, message->GetEdition());

    subject_register.Unregister(SS_SUBJECT0);
    message = subject_register.NextSubscriptionSync();
    ASSERT_TRUE(message);
    ASSERT_EQ(2, message->GetEdition());

    message = subject_register.NextSubscriptionSync();
    ASSERT_FALSE(message);
}